

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlspwin.c
# Opt level: O3

void Create_LispWindow(DspInterface dsp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long uVar5;
  int iVar6;
  Window WVar7;
  GC p_Var8;
  Pixmap PVar9;
  ulong uVar10;
  unsigned_long *puVar11;
  uint uVar12;
  Display *pDVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  unsigned_long uStack_3a0;
  unsigned_long uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 uStack_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 uStack_340;
  undefined8 uStack_338;
  undefined4 auStack_330 [8];
  Window WStack_310;
  undefined8 uStack_308;
  undefined8 uStack_300;
  undefined8 uStack_280;
  undefined8 *puStack_278;
  DspInterface pDStack_270;
  XClassHint *pXStack_268;
  code *pcStack_260;
  ulong local_258;
  uint local_250;
  uint local_24c;
  ulong local_248;
  ulong local_240;
  char *IT;
  char *WT;
  XClassHint xclasshint;
  XColor backgroundColor_xcsd;
  XColor foregroundColor_xcsd;
  XSetWindowAttributes Lisp_SetWinAttributes;
  XTextProperty WindowNameText;
  XTextProperty IconText;
  XWMHints Lisp_WMhints;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  XGCValues gcv;
  
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  Lisp_WMhints.icon_x = 0;
  Lisp_WMhints.icon_y = 0;
  Lisp_WMhints.icon_mask = 0;
  Lisp_WMhints.icon_pixmap = 0;
  Lisp_WMhints.icon_window = 0;
  Lisp_WMhints.flags = 0;
  Lisp_WMhints.input = 0;
  Lisp_WMhints.initial_state = 0;
  Lisp_WMhints.window_group = 0;
  xclasshint.res_name = (char *)0x0;
  xclasshint.res_class = (char *)0x0;
  IconText.format = 0;
  IconText._20_4_ = 0;
  IconText.nitems = 0;
  IconText.value = (uchar *)0x0;
  IconText.encoding = 0;
  WindowNameText.format = 0;
  WindowNameText._20_4_ = 0;
  WindowNameText.nitems = 0;
  WindowNameText.value = (uchar *)0x0;
  WindowNameText.encoding = 0;
  Lisp_SetWinAttributes.colormap = 0;
  Lisp_SetWinAttributes.cursor = 0;
  Lisp_SetWinAttributes.do_not_propagate_mask = 0;
  Lisp_SetWinAttributes.override_redirect = 0;
  Lisp_SetWinAttributes._92_4_ = 0;
  Lisp_SetWinAttributes.save_under = 0;
  Lisp_SetWinAttributes._68_4_ = 0;
  Lisp_SetWinAttributes.event_mask = 0;
  Lisp_SetWinAttributes.backing_planes = 0;
  Lisp_SetWinAttributes.backing_pixel = 0;
  Lisp_SetWinAttributes.bit_gravity = 0;
  Lisp_SetWinAttributes.win_gravity = 0;
  Lisp_SetWinAttributes.backing_store = 0;
  Lisp_SetWinAttributes._44_4_ = 0;
  Lisp_SetWinAttributes.border_pixmap = 0;
  Lisp_SetWinAttributes.border_pixel = 0;
  Lisp_SetWinAttributes.background_pixmap = 0;
  Lisp_SetWinAttributes.background_pixel = 0;
  gcv.clip_mask = 0;
  gcv.dash_offset = 0;
  gcv.dashes = '\0';
  gcv._125_3_ = 0;
  gcv.subwindow_mode = 0;
  gcv.graphics_exposures = 0;
  gcv.clip_x_origin = 0;
  gcv.clip_y_origin = 0;
  gcv.ts_x_origin = 0;
  gcv.ts_y_origin = 0;
  gcv.font = 0;
  gcv.tile = 0;
  gcv.stipple = 0;
  gcv.fill_style = 0;
  gcv.fill_rule = 0;
  gcv.arc_mode = 0;
  gcv._60_4_ = 0;
  gcv.line_width = 0;
  gcv.line_style = 0;
  gcv.cap_style = 0;
  gcv.join_style = 0;
  gcv.foreground = 0;
  gcv.background = 0;
  gcv.function = 0;
  gcv._4_4_ = 0;
  gcv.plane_mask = 0;
  WT = windowTitle;
  IT = iconTitle;
  uVar15 = (ulong)dsp->ScrollBarWidth;
  uVar3 = dsp->InternalBorderWidth;
  uVar12 = (dsp->Visible).width;
  uVar10 = (ulong)(dsp->Visible).height;
  pDVar13 = dsp->display_id;
  local_258 = *(ulong *)(pDVar13 + 0xe8);
  lVar16 = (long)*(int *)(pDVar13 + 0xe0) * 0x80;
  foregroundPixel = *(unsigned_long *)(local_258 + 0x60 + lVar16);
  backgroundPixel = *(unsigned_long *)(local_258 + 0x58 + lVar16);
  if (foregroundColorName[0] != '\0') {
    pcStack_260 = (code *)0x1400c0;
    iVar6 = XAllocNamedColor(pDVar13,Colors,foregroundColorName,&foregroundColor_xcsd,
                             &foregroundColor_xcsd);
    iVar14 = (int)pDVar13;
    if (iVar6 == 0) {
      pcStack_260 = (code *)0x140b97;
      Create_LispWindow_cold_1();
      goto LAB_00140b97;
    }
    pDVar13 = dsp->display_id;
    foregroundPixel = foregroundColor_xcsd.pixel;
  }
  local_250 = uVar3;
  local_24c = uVar12;
  local_248 = uVar10;
  local_240 = uVar15;
  if (backgroundColorName[0] != '\0') {
    pcStack_260 = (code *)0x140118;
    iVar6 = XAllocNamedColor(pDVar13,Colors,backgroundColorName,&backgroundColor_xcsd,
                             &backgroundColor_xcsd);
    iVar14 = (int)pDVar13;
    if (iVar6 == 0) {
LAB_00140b97:
      pcStack_260 = lisp_Xvideocolor;
      Create_LispWindow_cold_2();
      pDStack_270 = dsp;
      pXStack_268 = (XClassHint *)uVar15;
      pcStack_260 = (code *)lVar16;
      memset(auStack_330,0,0xc0);
      uStack_340 = 0;
      uStack_338 = 0;
      uStack_350 = 0;
      uStack_348 = 0;
      uStack_360 = 0;
      uStack_358 = 0;
      uStack_370 = 0;
      uStack_368 = 0;
      uStack_380 = 0;
      uStack_378 = 0;
      uStack_390 = 0;
      uStack_388 = 0;
      uStack_3a0 = 0;
      uStack_398 = 0;
      uStack_3b0 = 0;
      uStack_3a8 = 0;
      puVar11 = &foregroundPixel;
      if (iVar14 != 0) {
        puVar11 = &backgroundPixel;
      }
      uVar5 = *puVar11;
      XGetGCValues(currentdsp->display_id,currentdsp->Copy_GC,0xc,&uStack_3b0);
      if (uVar5 != uStack_3a0) {
        uStack_398 = uStack_3a0;
        uStack_3a0 = uVar5;
        XChangeGC(currentdsp->display_id,currentdsp->Copy_GC,0xc);
        auStack_330[0] = 0xc;
        WStack_310 = currentdsp->DisplayWindow;
        uStack_308 = 0;
        uStack_300._0_4_ = (currentdsp->Visible).width;
        uStack_300._4_4_ = (currentdsp->Visible).height;
        XSendEvent(currentdsp->display_id,WStack_310,1,0);
      }
      XFlush(currentdsp->display_id);
      return;
    }
    backgroundPixel = backgroundColor_xcsd.pixel;
    pDVar13 = dsp->display_id;
  }
  uVar10 = local_258 + lVar16;
  iVar6 = dsp->InternalBorderWidth * 2 + dsp->ScrollBarWidth;
  puStack_278 = (undefined8 *)0x0;
  uStack_280 = 0x14019a;
  pDStack_270 = (DspInterface)foregroundPixel;
  pXStack_268 = (XClassHint *)backgroundPixel;
  local_258 = uVar10;
  WVar7 = XCreateSimpleWindow(pDVar13,*(undefined8 *)(uVar10 + 0x10),LispWindowRequestedX,
                              LispWindowRequestedY,(dsp->Visible).width + iVar6,
                              iVar6 + (dsp->Visible).height);
  dsp->LispWindow = WVar7;
  Lisp_SetWinAttributes.bit_gravity = dsp->BitGravity;
  Lisp_SetWinAttributes._88_8_ = Lisp_SetWinAttributes._88_8_ & 0xffffffff00000000;
  Lisp_SetWinAttributes.backing_store = *(int *)(uVar10 + 0x70);
  pcStack_260 = (code *)0x1401d5;
  XChangeWindowAttributes(dsp->display_id,WVar7,0x210,&Lisp_SetWinAttributes);
  dsp->DisableEventMask = 0;
  dsp->EnableEventMask = 0x2807f;
  gcv.function = 3;
  gcv.foreground = foregroundPixel;
  gcv.background = backgroundPixel;
  pcStack_260 = (code *)0x140227;
  p_Var8 = (GC)XCreateGC(dsp->display_id,dsp->LispWindow,0xd);
  dsp->Copy_GC = p_Var8;
  iVar6 = dsp->InternalBorderWidth * 2 + dsp->ScrollBarWidth;
  uVar1 = (dsp->Display).width;
  uVar2 = (dsp->Display).height;
  local_e8 = CONCAT44(iVar6 + uVar2,iVar6 + uVar1);
  uStack_f0 = CONCAT44(iVar6,iVar6);
  uStack_c0 = CONCAT44(uStack_c0._4_4_,dsp->BitGravity);
  local_108 = 0x228;
  pcStack_260 = (code *)0x14027d;
  Lisp_WMhints.icon_pixmap = make_Xicon(dsp);
  Lisp_WMhints.input = 1;
  Lisp_WMhints.flags = 5;
  xclasshint.res_name = *save_argv;
  pcStack_260 = (code *)0x1402cb;
  xclasshint.res_class = xclasshint.res_name;
  XStringListToTextProperty(&WT,1,&WindowNameText);
  pcStack_260 = (code *)0x1402e5;
  XStringListToTextProperty(&IT,1,&IconText);
  uStack_280 = 0x14031b;
  puStack_278 = &local_108;
  pDStack_270 = (DspInterface)&Lisp_WMhints;
  pXStack_268 = &xclasshint;
  XSetWMProperties(dsp->display_id,dsp->LispWindow,&WindowNameText,&IconText,save_argv,save_argc);
  pcStack_260 = (code *)0x140339;
  XSelectInput(dsp->display_id,dsp->LispWindow,dsp->EnableEventMask);
  pcStack_260 = (code *)0x140341;
  init_Xcursor(dsp);
  pXStack_268 = (XClassHint *)backgroundPixel;
  pDStack_270 = (DspInterface)foregroundPixel;
  puStack_278 = (undefined8 *)0x0;
  uStack_280 = 0x14037b;
  WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,0,0,(dsp->Visible).width,
                              (dsp->Visible).height);
  dsp->DisplayWindow = WVar7;
  pcStack_260 = (code *)0x14039f;
  XChangeWindowAttributes(dsp->display_id,WVar7,0x250,&Lisp_SetWinAttributes);
  pcStack_260 = (code *)0x1403b9;
  XSelectInput(dsp->display_id,dsp->DisplayWindow,dsp->EnableEventMask);
  pcStack_260 = (code *)0x1403cc;
  XMapWindow(dsp->display_id,dsp->DisplayWindow);
  uVar10 = local_258;
  pcStack_260 = (code *)(ulong)*(uint *)(local_258 + 0x38);
  pXStack_268 = (XClassHint *)backgroundPixel;
  pDStack_270 = (DspInterface)0x14040b;
  PVar9 = XCreatePixmapFromBitmapData
                    (dsp->display_id,dsp->LispWindow,check_bits,0x10,0x10,foregroundPixel);
  dsp->ScrollBarPixmap = PVar9;
  pcStack_260 = (code *)(ulong)*(uint *)(uVar10 + 0x38);
  pXStack_268 = (XClassHint *)backgroundPixel;
  pDStack_270 = (DspInterface)0x14044a;
  PVar9 = XCreatePixmapFromBitmapData
                    (dsp->display_id,dsp->LispWindow,check_bits,0x10,0x10,foregroundPixel);
  dsp->GravityOnPixmap = PVar9;
  pcStack_260 = (code *)(ulong)*(uint *)(uVar10 + 0x38);
  pXStack_268 = (XClassHint *)backgroundPixel;
  pDStack_270 = (DspInterface)0x14048d;
  PVar9 = XCreatePixmapFromBitmapData(dsp->display_id,dsp->LispWindow,plain_bits,0x10,0x10);
  dsp->GravityOffPixmap = PVar9;
  pcStack_260 = (code *)0x1404b5;
  set_Xcursor(dsp,defaultcursor_bitmap,0,0,&DefaultCursor,0);
  pcStack_260 = (code *)0x1404d8;
  set_Xcursor(dsp,waitcursor_bitmap,7,7,&WaitCursor,0);
  pcStack_260 = (code *)0x1404f8;
  set_Xcursor(dsp,scrolldowncursor_bitmap,7,0,&ScrollDownCursor,0);
  pcStack_260 = (code *)0x14051b;
  set_Xcursor(dsp,"",8,10,&ScrollLeftCursor,0);
  pcStack_260 = (code *)0x14053b;
  set_Xcursor(dsp,"\x01",7,0,&VertScrollCursor,0);
  pcStack_260 = (code *)0x14055e;
  set_Xcursor(dsp,"",8,7,&VertThumbCursor,0);
  pcStack_260 = (code *)0x140581;
  set_Xcursor(dsp,"",7,10,&HorizScrollCursor,0);
  pcStack_260 = (code *)0x1405a4;
  set_Xcursor(dsp,"",6,7,&HorizThumbCursor,0);
  pcStack_260 = (code *)0x1405c7;
  set_Xcursor(dsp,"",7,10,&ScrollRightCursor,0);
  pcStack_260 = (code *)0x1405e7;
  set_Xcursor(dsp,"\x01",7,0,&ScrollUpCursor,0);
  uVar10 = local_248;
  uVar3 = local_24c;
  if (noscroll == 0) {
    uVar12 = (uint)(local_240 >> 1) & 0x7fffffff;
    iVar14 = uVar12 - local_250;
    uVar12 = uVar12 + local_250 & 0x7fffffff;
    local_258 = CONCAT44(local_258._4_4_,(int)local_248 + uVar12);
    iVar6 = uVar12 + local_24c;
    puStack_278 = (undefined8 *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x140664;
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,local_24c,-dsp->InternalBorderWidth,
                                dsp->ScrollBarWidth,(dsp->Visible).height);
    dsp->VerScrollBar = WVar7;
    pcStack_260 = (code *)0x140685;
    XDefineCursor(dsp->display_id,WVar7,VertScrollCursor);
    pcStack_260 = (code *)0x140698;
    XMapWindow(dsp->display_id,dsp->VerScrollBar);
    puStack_278 = (undefined8 *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x1406d7;
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,-dsp->InternalBorderWidth,
                                uVar10 & 0xffffffff,(dsp->Visible).width,dsp->ScrollBarWidth);
    dsp->HorScrollBar = WVar7;
    pcStack_260 = (code *)0x1406f8;
    XDefineCursor(dsp->display_id,WVar7,HorizScrollCursor);
    pcStack_260 = (code *)0x140715;
    XChangeWindowAttributes(dsp->display_id,dsp->HorScrollBar,0x200,&Lisp_SetWinAttributes);
    pcStack_260 = (code *)0x140728;
    XMapWindow(dsp->display_id,dsp->HorScrollBar);
    puStack_278 = (undefined8 *)(ulong)dsp->InternalBorderWidth;
    uVar12 = (dsp->Visible).height;
    uVar4 = (dsp->Display).height;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x140794;
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->VerScrollBar,-dsp->InternalBorderWidth,
                                (long)(int)((dsp->Visible).y * uVar12) / (long)(int)uVar4 &
                                0xffffffff,dsp->ScrollBarWidth,(uVar12 * uVar12) / uVar4 + 1);
    dsp->VerScrollButton = WVar7;
    pcStack_260 = (code *)0x1407bb;
    XChangeWindowAttributes(dsp->display_id,WVar7,0x200,&Lisp_SetWinAttributes);
    pcStack_260 = (code *)0x1407d5;
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->VerScrollButton,dsp->ScrollBarPixmap);
    pcStack_260 = (code *)0x1407e8;
    XClearWindow(dsp->display_id,dsp->VerScrollButton);
    pcStack_260 = (code *)0x1407fb;
    XMapWindow(dsp->display_id,dsp->VerScrollButton);
    uVar12 = (dsp->Visible).width;
    uVar4 = (dsp->Display).width;
    puStack_278 = (undefined8 *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x140865;
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->HorScrollBar,
                                (long)(int)((dsp->Visible).x * uVar12) / (long)(int)uVar4 &
                                0xffffffff,-dsp->InternalBorderWidth,(uVar12 * uVar12) / uVar4 + 1,
                                dsp->ScrollBarWidth);
    dsp->HorScrollButton = WVar7;
    pcStack_260 = (code *)0x140887;
    XChangeWindowAttributes(dsp->display_id,WVar7,0x200,&Lisp_SetWinAttributes);
    pcStack_260 = (code *)0x1408a1;
    XSetWindowBackgroundPixmap(dsp->display_id,dsp->HorScrollButton,dsp->ScrollBarPixmap);
    pcStack_260 = (code *)0x1408b4;
    XClearWindow(dsp->display_id,dsp->HorScrollButton);
    pcStack_260 = (code *)0x1408c7;
    XMapWindow(dsp->display_id,dsp->HorScrollButton);
    puStack_278 = (undefined8 *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x1408fd;
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,uVar3,uVar10 & 0xffffffff,iVar14,
                                iVar14);
    dsp->NWGrav = WVar7;
    pcStack_260 = (code *)0x14091e;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar7,dsp->GravityOnPixmap);
    pcStack_260 = (code *)0x140938;
    XDefineCursor(dsp->display_id,dsp->NWGrav,DefaultCursor);
    pcStack_260 = (code *)0x140956;
    XChangeWindowAttributes(dsp->display_id,dsp->NWGrav,0x200,&Lisp_SetWinAttributes);
    pcStack_260 = (code *)0x140969;
    XClearWindow(dsp->display_id,dsp->NWGrav);
    pcStack_260 = (code *)0x14097c;
    XMapWindow(dsp->display_id,dsp->NWGrav);
    uVar10 = local_258;
    puStack_278 = (undefined8 *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x1409b6;
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,iVar6,local_258 & 0xffffffff,iVar14,
                                iVar14);
    dsp->SEGrav = WVar7;
    pcStack_260 = (code *)0x1409d7;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar7,dsp->GravityOffPixmap);
    pcStack_260 = (code *)0x1409f1;
    XDefineCursor(dsp->display_id,dsp->SEGrav,DefaultCursor);
    pcStack_260 = (code *)0x140a0c;
    XChangeWindowAttributes(dsp->display_id,dsp->SEGrav,0x200,&Lisp_SetWinAttributes);
    pcStack_260 = (code *)0x140a1f;
    XClearWindow(dsp->display_id,dsp->NWGrav);
    pcStack_260 = (code *)0x140a32;
    XMapWindow(dsp->display_id,dsp->SEGrav);
    puStack_278 = (undefined8 *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x140a68;
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,uVar3,uVar10 & 0xffffffff,iVar14,
                                iVar14);
    dsp->SWGrav = WVar7;
    pcStack_260 = (code *)0x140a89;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar7,dsp->GravityOffPixmap);
    pcStack_260 = (code *)0x140aa3;
    XDefineCursor(dsp->display_id,dsp->SWGrav,DefaultCursor);
    pcStack_260 = (code *)0x140ab6;
    XClearWindow(dsp->display_id,dsp->NWGrav);
    pcStack_260 = (code *)0x140ac9;
    XMapWindow(dsp->display_id,dsp->SWGrav);
    puStack_278 = (undefined8 *)(ulong)dsp->InternalBorderWidth;
    pXStack_268 = (XClassHint *)backgroundPixel;
    pDStack_270 = (DspInterface)foregroundPixel;
    uStack_280 = 0x140b00;
    WVar7 = XCreateSimpleWindow(dsp->display_id,dsp->LispWindow,iVar6,local_248,iVar14,iVar14);
    dsp->NEGrav = WVar7;
    pcStack_260 = (code *)0x140b21;
    XSetWindowBackgroundPixmap(dsp->display_id,WVar7,dsp->GravityOffPixmap);
    pcStack_260 = (code *)0x140b3b;
    XDefineCursor(dsp->display_id,dsp->NEGrav,DefaultCursor);
    pcStack_260 = (code *)0x140b4e;
    XClearWindow(dsp->display_id,dsp->NWGrav);
    pcStack_260 = (code *)0x140b61;
    XMapWindow(dsp->display_id,dsp->NEGrav);
  }
  pcStack_260 = (code *)0x140b74;
  XMapWindow(dsp->display_id,dsp->LispWindow);
  pcStack_260 = (code *)0x140b80;
  XFlush(dsp->display_id);
  return;
}

Assistant:

void Create_LispWindow(DspInterface dsp)
{
  extern char foregroundColorName[];
  extern char backgroundColorName[];
  XColor foregroundColor_xcsd;
  XColor backgroundColor_xcsd;
  Status status;
  XSizeHints szhint = {0};
  XWMHints Lisp_WMhints = {0};
  XClassHint xclasshint = {0};
  XTextProperty IconText = {0}, WindowNameText = {0};
  XSetWindowAttributes Lisp_SetWinAttributes = {0};
  XGCValues gcv = {0};

  Screen *screen;

  unsigned int Col2, Row2, Col3, Row3;
  unsigned int GravSize;
  char *WT, *IT;

  WT = windowTitle;
  IT = iconTitle;

  GravSize = (dsp->ScrollBarWidth / 2) - dsp->InternalBorderWidth;
  Col2 = dsp->Visible.width;
  Row2 = dsp->Visible.height;
  Col3 = dsp->Visible.width + (OUTER_SB_WIDTH(dsp) / 2);
  Row3 = dsp->Visible.height + (OUTER_SB_WIDTH(dsp) / 2);

  screen = ScreenOfDisplay(dsp->display_id, DefaultScreen(dsp->display_id));
  /* set up default display as black on white */
  foregroundPixel = BlackPixelOfScreen(screen); 
  backgroundPixel = WhitePixelOfScreen(screen);
  /* parse and record non-default color specs for foreground and background */
  if (foregroundColorName[0]) {
    status = XAllocNamedColor(dsp->display_id, Colors, foregroundColorName, &foregroundColor_xcsd, &foregroundColor_xcsd);
    if (status == 0) {
      fprintf(stderr, "Color allocation failed for foreground color: %s\n", foregroundColorName);
      exit(1);
    }
    foregroundPixel = foregroundColor_xcsd.pixel;
  }
  if (backgroundColorName[0]) {
    status = XAllocNamedColor(dsp->display_id, Colors, backgroundColorName, &backgroundColor_xcsd, &backgroundColor_xcsd);
    if (status == 0) {
      fprintf(stderr, "Color allocation failed for background color: %s\n", backgroundColorName);
      exit(1);
    }
    backgroundPixel = backgroundColor_xcsd.pixel;
  }
  dsp->LispWindow = XCreateSimpleWindow(
      dsp->display_id, RootWindowOfScreen(screen), LispWindowRequestedX, /* Default upper left */
      LispWindowRequestedY,                                              /* Default upper left */
      dsp->Visible.width + OUTER_SB_WIDTH(dsp),                         /* Default width */
      dsp->Visible.height + OUTER_SB_WIDTH(dsp),                        /* Default height */
      0,                                                                 /* Default border */
      foregroundPixel, backgroundPixel);

  Lisp_SetWinAttributes.bit_gravity = dsp->BitGravity;
  Lisp_SetWinAttributes.override_redirect = False;
  Lisp_SetWinAttributes.backing_store = DoesBackingStore(screen);

  XChangeWindowAttributes(dsp->display_id, dsp->LispWindow, CWBitGravity | CWOverrideRedirect,
                          &Lisp_SetWinAttributes);

  dsp->DisableEventMask = NoEventMask;
  dsp->EnableEventMask = ButtonPressMask | ButtonReleaseMask | EnterWindowMask | LeaveWindowMask |
                         StructureNotifyMask | PointerMotionMask | ExposureMask | KeyPressMask |
                         KeyReleaseMask;

  /* Have to make the GC before we make the icon. */
  gcv.function = GXcopy;
  gcv.foreground = foregroundPixel;
  gcv.background = backgroundPixel;
  dsp->Copy_GC =
      XCreateGC(dsp->display_id, dsp->LispWindow, GCForeground | GCBackground | GCFunction, &gcv);

  szhint.max_width = (int)(dsp->Display.width + OUTER_SB_WIDTH(dsp));
  szhint.max_height = (int)(dsp->Display.height + OUTER_SB_WIDTH(dsp));
  szhint.min_width = (int)OUTER_SB_WIDTH(dsp);
  szhint.min_height = (int)OUTER_SB_WIDTH(dsp);
  szhint.win_gravity = dsp->BitGravity;
  szhint.flags = PMaxSize | PWinGravity | PSize;

  Lisp_WMhints.icon_pixmap = make_Xicon(dsp);
  Lisp_WMhints.input = True;
  Lisp_WMhints.flags = IconPixmapHint | InputHint;

  xclasshint.res_name = *save_argv;
  xclasshint.res_class = *save_argv;

  XStringListToTextProperty(&WT, 1, &WindowNameText);
  XStringListToTextProperty(&IT, 1, &IconText);

  XSetWMProperties(dsp->display_id, dsp->LispWindow, &WindowNameText, &IconText, save_argv,
                   save_argc, &szhint, &Lisp_WMhints, &xclasshint);

  XSelectInput(dsp->display_id, dsp->LispWindow, dsp->EnableEventMask);
  init_Xcursor(dsp);

  dsp->DisplayWindow = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, 0, 0,
                                           dsp->Visible.width, dsp->Visible.height, 0,
                                           foregroundPixel, backgroundPixel);
  XChangeWindowAttributes(dsp->display_id, dsp->DisplayWindow,
                          CWBitGravity | CWOverrideRedirect | CWBackingStore,
                          &Lisp_SetWinAttributes);
  XSelectInput(dsp->display_id, dsp->DisplayWindow, dsp->EnableEventMask);
  XMapWindow(dsp->display_id, dsp->DisplayWindow);

  /*********************************************************************/
  /* Create all the vanilla pixmaps and cursors for the display window */
  /*********************************************************************/

  dsp->ScrollBarPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)check_bits, check_width, check_height,
      foregroundPixel, backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));
  dsp->GravityOnPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)check_bits, 16, 16, foregroundPixel,
      backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));

  dsp->GravityOffPixmap = XCreatePixmapFromBitmapData(
      dsp->display_id, dsp->LispWindow, (char *)plain_bits, 16, 16, foregroundPixel,
      backgroundPixel, (unsigned)DefaultDepthOfScreen(screen));

  set_Xcursor(dsp, default_cursor.cuimage, (int)default_cursor.cuhotspotx,
              (int)(15 - default_cursor.cuhotspoty), &DefaultCursor, 0);
  set_Xcursor(dsp, wait_cursor.cuimage, (int)wait_cursor.cuhotspotx,
              (int)(15 - wait_cursor.cuhotspoty), &WaitCursor, 0);
  set_Xcursor(dsp, scrolldown_cursor.cuimage, (int)scrolldown_cursor.cuhotspotx,
              (int)(15 - scrolldown_cursor.cuhotspoty), &ScrollDownCursor, 0);
  set_Xcursor(dsp, scrollleft_cursor.cuimage, (int)scrollleft_cursor.cuhotspotx,
              (int)(15 - scrollleft_cursor.cuhotspoty), &ScrollLeftCursor, 0);
  set_Xcursor(dsp, vertscroll_cursor.cuimage, (int)vertscroll_cursor.cuhotspotx,
              (int)(15 - vertscroll_cursor.cuhotspoty), &VertScrollCursor, 0);
  set_Xcursor(dsp, vertthumb_cursor.cuimage, (int)vertthumb_cursor.cuhotspotx,
              (int)(15 - vertthumb_cursor.cuhotspoty), &VertThumbCursor, 0);
  set_Xcursor(dsp, horizscroll_cursor.cuimage, (int)horizscroll_cursor.cuhotspotx,
              (int)(15 - horizscroll_cursor.cuhotspoty), &HorizScrollCursor, 0);
  set_Xcursor(dsp, horizthumb_cursor.cuimage, (int)horizthumb_cursor.cuhotspotx,
              (int)(15 - horizthumb_cursor.cuhotspoty), &HorizThumbCursor, 0);
  set_Xcursor(dsp, scrollright_cursor.cuimage, (int)scrollright_cursor.cuhotspotx,
              (int)(15 - scrollright_cursor.cuhotspoty), &ScrollRightCursor, 0);
  set_Xcursor(dsp, scrollup_cursor.cuimage, (int)scrollup_cursor.cuhotspotx,
              (int)(15 - scrollup_cursor.cuhotspoty), &ScrollUpCursor, 0);

  if (noscroll == 0) {
    /********************************/
    /* Make all the toolkit windows */
    /********************************/
    dsp->VerScrollBar = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2,
                                            0 - (int)dsp->InternalBorderWidth, /* y */
                                            dsp->ScrollBarWidth,          /* width */
                                            dsp->Visible.height, dsp->InternalBorderWidth,
                                            foregroundPixel, backgroundPixel);
    DefineCursor(dsp, dsp->VerScrollBar, &VertScrollCursor);
    XMapWindow(dsp->display_id, dsp->VerScrollBar);

    dsp->HorScrollBar = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow,
                                            0 - (int)dsp->InternalBorderWidth, (int)Row2, /* y */
                                            dsp->Visible.width,                /* width */
                                            dsp->ScrollBarWidth, dsp->InternalBorderWidth,
                                            foregroundPixel, backgroundPixel);
    DefineCursor(dsp, dsp->HorScrollBar, &HorizScrollCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->HorScrollBar, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XMapWindow(dsp->display_id, dsp->HorScrollBar);

    dsp->VerScrollButton = XCreateSimpleWindow(
                                               dsp->display_id, dsp->VerScrollBar, 0 - (int)dsp->InternalBorderWidth,      /* x */
                                               (dsp->Visible.y * (int)dsp->Visible.height) / (int)dsp->Display.height, /* y */
                                               dsp->ScrollBarWidth,                                                   /* width */
                                               ((dsp->Visible.height * dsp->Visible.height) / dsp->Display.height) + 1,
                                               dsp->InternalBorderWidth, foregroundPixel, backgroundPixel);
    XChangeWindowAttributes(dsp->display_id, dsp->VerScrollButton, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->VerScrollButton, dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id, dsp->VerScrollButton);
    XMapWindow(dsp->display_id, dsp->VerScrollButton);

    dsp->HorScrollButton = XCreateSimpleWindow(
                                               dsp->display_id, dsp->HorScrollBar,
                                               (dsp->Visible.x * (int)dsp->Visible.width) / (int)dsp->Display.width,
                                               0 - (int)dsp->InternalBorderWidth, /* y */
                                               ((dsp->Visible.width * dsp->Visible.width) / dsp->Display.width) + 1,
                                               dsp->ScrollBarWidth, dsp->InternalBorderWidth, foregroundPixel,
                                               backgroundPixel);
    XChangeWindowAttributes(dsp->display_id, dsp->HorScrollButton, CWOverrideRedirect,
                            &Lisp_SetWinAttributes);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->HorScrollButton, dsp->ScrollBarPixmap);
    XClearWindow(dsp->display_id, dsp->HorScrollButton);
    XMapWindow(dsp->display_id, dsp->HorScrollButton);

    dsp->NWGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2, (int)Row2, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->NWGrav, dsp->GravityOnPixmap);
    DefineCursor(dsp, dsp->NWGrav, &DefaultCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->NWGrav, CWOverrideRedirect, &Lisp_SetWinAttributes);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->NWGrav);

    dsp->SEGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col3, (int)Row3, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->SEGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->SEGrav, &DefaultCursor);
    XChangeWindowAttributes(dsp->display_id, dsp->SEGrav, CWOverrideRedirect, &Lisp_SetWinAttributes);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->SEGrav);

    dsp->SWGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col2, (int)Row3, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->SWGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->SWGrav, &DefaultCursor);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->SWGrav);

    dsp->NEGrav = XCreateSimpleWindow(dsp->display_id, dsp->LispWindow, (int)Col3, (int)Row2, GravSize,
                                      GravSize, dsp->InternalBorderWidth, foregroundPixel,
                                      backgroundPixel);
    XSetWindowBackgroundPixmap(dsp->display_id, dsp->NEGrav, dsp->GravityOffPixmap);
    DefineCursor(dsp, dsp->NEGrav, &DefaultCursor);
    XClearWindow(dsp->display_id, dsp->NWGrav);
    XMapWindow(dsp->display_id, dsp->NEGrav);
  }
  /* DefineCursor( dsp, dsp->DisplayWindow, &WaitCursor ); */

  XLOCK;
  XMapWindow(dsp->display_id, dsp->LispWindow);
  XFlush(dsp->display_id);
  XUNLOCK(dsp);
}